

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.cpp
# Opt level: O0

Oop Lodtalk::ByteString::splitVariableNames(VMContext *context,string *string)

{
  size_type indexableSize;
  Array *p;
  value_type *pvVar1;
  reference pvVar2;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar3;
  ProtoObject *this;
  uint8_t *puVar4;
  pair<int,_unsigned_long> pVar5;
  Oop *resultData;
  Oop subString;
  value_type *startSize;
  size_t i_1;
  Ref<Lodtalk::Array> result;
  pair<int,_unsigned_long> local_a8;
  pair<int,_int> local_94 [2];
  unsigned_long local_80;
  pair<int,_unsigned_long> local_78;
  pair<int,_int> local_64;
  char local_59;
  ulong uStack_58;
  char c;
  size_t i;
  ulong uStack_48;
  int tokenStart;
  size_type size;
  char *data;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> varNameIndices;
  string *string_local;
  VMContext *context_local;
  
  varNameIndices.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)string;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&data);
  size = std::__cxx11::string::data();
  uStack_48 = std::__cxx11::string::size();
  i._4_4_ = -1;
  for (uStack_58 = 0; uStack_58 < uStack_48; uStack_58 = uStack_58 + 1) {
    local_59 = *(char *)(size + uStack_58);
    if (i._4_4_ < 0) {
      if (' ' < local_59) {
        i._4_4_ = (int)uStack_58;
      }
    }
    else if (local_59 < '!') {
      local_80 = uStack_58 - (long)i._4_4_;
      pVar5 = std::make_pair<int&,unsigned_long>((int *)((long)&i + 4),&local_80);
      local_78.second = pVar5.second;
      local_78.first = pVar5.first;
      std::pair<int,_int>::pair<int,_unsigned_long,_true>(&local_64,&local_78);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&data,
                 &local_64);
      i._4_4_ = -1;
    }
  }
  if (-1 < i._4_4_) {
    result.reference.nextReference_ = (OopRef *)(uStack_48 - (long)i._4_4_);
    pVar5 = std::make_pair<int&,unsigned_long>
                      ((int *)((long)&i + 4),(unsigned_long *)&result.reference.nextReference_);
    local_a8.second = pVar5.second;
    local_a8.first = pVar5.first;
    std::pair<int,_int>::pair<int,_unsigned_long,_true>(local_94,&local_a8);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&data,local_94)
    ;
  }
  indexableSize =
       std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                 ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&data);
  p = Array::basicNativeNew(context,indexableSize);
  Ref<Lodtalk::Array>::Ref((Ref<Lodtalk::Array> *)&i_1,context,p);
  for (startSize = (value_type *)0x0;
      pvVar1 = (value_type *)
               std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          &data), startSize < pvVar1;
      startSize = (value_type *)((long)&startSize->first + 1)) {
    pvVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&data,
                        (size_type)startSize);
    aVar3 = (anon_union_8_4_0eb573b0_for_Oop_0)
            ByteSymbol::fromNativeRange
                      (context,(char *)(size + (long)pvVar2->first),(long)pvVar2->second);
    this = (ProtoObject *)Ref<Lodtalk::Array>::operator->((Ref<Lodtalk::Array> *)&i_1);
    puVar4 = ProtoObject::getFirstFieldPointer(this);
    *(anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar4 + (long)startSize * 8) = aVar3;
  }
  aVar3 = (anon_union_8_4_0eb573b0_for_Oop_0)
          Ref<Lodtalk::Array>::getOop((Ref<Lodtalk::Array> *)&i_1);
  Ref<Lodtalk::Array>::~Ref((Ref<Lodtalk::Array> *)&i_1);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&data);
  return (Oop)aVar3.pointer;
}

Assistant:

Oop ByteString::splitVariableNames(VMContext *context, const std::string &string)
{
	std::vector<std::pair<int, int>> varNameIndices;

	auto data = string.data();
	auto size = string.size();
	int tokenStart = -1;

	for(size_t i = 0; i < size; ++i)
	{
		auto c = data[i];
		if(tokenStart < 0)
		{
			// I am not in a token.
			if(c > ' ')
				tokenStart = (int)i;
		}
		else
		{
			// Inside token.
			if(c <= ' ')
			{
				varNameIndices.push_back(std::make_pair(tokenStart, i - tokenStart));
				tokenStart = -1;
			}
		}
	}

	// Push the last token.
	if(tokenStart >= 0)
		varNameIndices.push_back(std::make_pair(tokenStart, size - tokenStart));

	// Allocate the result.
	Ref<Array> result(context, Array::basicNativeNew(context, varNameIndices.size()));
	for(size_t i = 0; i < varNameIndices.size(); ++i)
	{
		auto &startSize = varNameIndices[i];
		auto subString = ByteSymbol::fromNativeRange(context, (char*)data + startSize.first, startSize.second);
		auto resultData = reinterpret_cast<Oop*> (result->getFirstFieldPointer());
		resultData[i] = subString;
	}

	return result.getOop();
}